

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_locate_region(Integer g_a,Integer *lo,Integer *hi,Integer *map,Integer *proclist,
                          Integer *np)

{
  short sVar1;
  short sVar2;
  C_Integer *pCVar3;
  bool bVar4;
  long lVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long *in_R9;
  Integer size;
  Integer p_handle;
  Integer iproc;
  Integer factor;
  Integer idx;
  Integer offset_3;
  Integer cnt_1;
  Integer total_blocks;
  Integer count [7];
  Integer max [7];
  Integer min [7];
  Integer offset_2;
  Integer cnt;
  Integer thi [7];
  Integer tlo [7];
  Integer j;
  Integer chk;
  Integer nblocks;
  Integer _i_15;
  int _ndim_9;
  int _i_14;
  int _itmp_3;
  int _offset_1;
  int _ndim_8;
  int _i_13;
  int _index_7 [7];
  int _ndim_7;
  int _i_12;
  int _itmp_2;
  int _ndim_6;
  int _i_11;
  int _index_6 [7];
  int _ndim_5;
  int _i_10;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_3;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_2;
  Integer _nb_2;
  Integer _loc_2;
  Integer _factor_1;
  Integer _i_9;
  Integer offset_1;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _i_8;
  C_Integer *map_4;
  int b_3;
  int found_3;
  int candidate_3;
  C_Integer *map_3;
  int b_2;
  int found_2;
  int candidate_2;
  Integer nproc;
  Integer _i_7;
  int _ndim_4;
  int _i_6;
  int _itmp_1;
  int _offset;
  int _ndim_3;
  int _i_5;
  int _index_3 [7];
  int _ndim_2;
  int _i_4;
  int _itmp;
  int _ndim_1;
  int _i_3;
  int _index_2 [7];
  int _ndim;
  int _i_2;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_1;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d;
  Integer _nb;
  Integer _loc;
  Integer _factor;
  Integer _i_1;
  Integer offset;
  Integer _hi [7];
  Integer _lo [7];
  Integer _i;
  C_Integer *map_2;
  int b_1;
  int found_1;
  int candidate_1;
  C_Integer *map_1;
  int b;
  int found;
  int candidate;
  char err_string_1 [256];
  char err_string [256];
  Integer use_blocks;
  Integer elems;
  Integer ndim;
  Integer dpos;
  Integer d;
  Integer ga_handle;
  Integer i;
  Integer owner;
  Integer proc;
  int proc_subscript [7];
  int procB [7];
  int procT [7];
  long local_830;
  long local_828;
  C_Integer local_818;
  undefined8 local_810;
  C_Integer local_808;
  C_Integer local_800;
  long local_7e0;
  long local_7d8;
  long local_7c8;
  long local_7b8 [8];
  long alStackY_778 [8];
  long alStackY_738 [8];
  long local_6f8;
  long local_6f0;
  long local_6e8 [8];
  long local_6a8 [2];
  Integer in_stack_fffffffffffff968;
  char *in_stack_fffffffffffff970;
  long local_670;
  long local_658;
  int local_64c;
  int local_648;
  int local_644;
  int local_63c;
  int local_638 [7];
  int local_61c;
  int local_618;
  int local_614;
  int local_610;
  int local_60c;
  int local_608 [8];
  int local_5e8;
  int local_5e4;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  long local_5c8;
  long local_5c0;
  long local_5b8;
  long local_5b0;
  long local_5a8;
  long local_5a0;
  long local_598;
  long local_590;
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  long local_568;
  long local_560;
  C_Integer aCStack_558 [6];
  Integer *in_stack_fffffffffffffad8;
  Integer *in_stack_fffffffffffffae0;
  Integer in_stack_fffffffffffffae8;
  Integer in_stack_fffffffffffffaf0;
  long local_4d8;
  int local_4c4;
  int local_4bc;
  int local_4ac;
  int local_4a4;
  long local_498;
  int local_48c;
  int local_488;
  int local_484;
  int local_47c;
  int local_478 [7];
  int local_45c;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  int local_448 [8];
  int local_428;
  int local_424;
  long local_420;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  C_Integer aCStack_398 [8];
  C_Integer aCStack_358 [7];
  long local_320;
  C_Integer *local_318;
  int local_30c;
  uint local_308;
  int local_304;
  C_Integer *local_300;
  int local_2f4;
  uint local_2f0;
  int local_2ec;
  char local_2e8 [256];
  char local_1e8 [272];
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [8];
  long *local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_1e8,"%s: INVALID ARRAY HANDLE","nga_locate_region");
    pnga_error(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  }
  if (GA[local_10 + 1000].actv == 0) {
    sprintf(local_2e8,"%s: ARRAY NOT ACTIVE","nga_locate_region");
    pnga_error(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  }
  local_b8 = local_10 + 1000;
  for (local_c0 = 0; local_c0 < GA[local_b8].ndim; local_c0 = local_c0 + 1) {
    if (((*(long *)(local_18 + local_c0 * 8) < 1) ||
        (GA[local_b8].dims[local_c0] < *(long *)(local_20 + local_c0 * 8))) ||
       (*(long *)(local_20 + local_c0 * 8) < *(long *)(local_18 + local_c0 * 8))) {
      return 0;
    }
  }
  sVar1 = GA[local_b8].ndim;
  local_d0 = (long)sVar1;
  if (GA[local_b8].distr_type == 0) {
    local_c8 = 0;
    for (local_c0 = 0; local_c0 < GA[local_b8].ndim; local_c0 = local_c0 + 1) {
      local_300 = GA[local_b8].mapc + local_c8;
      local_2ec = (int)(GA[local_b8].scale[local_c0] * (double)*(long *)(local_18 + local_c0 * 8));
      if (local_2ec == GA[local_b8].nblock[local_c0]) {
        local_2ec = GA[local_b8].nblock[local_c0] + -1;
      }
      local_2f0 = 0;
      if (*(long *)(local_18 + local_c0 * 8) < local_300[local_2ec]) {
        local_2f4 = local_2ec + -1;
        while ((-1 < local_2f4 &&
               (local_2f0 = (uint)(local_300[local_2f4] <= *(long *)(local_18 + local_c0 * 8)),
               local_2f0 == 0))) {
          local_2f4 = local_2f4 + -1;
        }
      }
      else {
        local_2f4 = local_2ec;
        while ((local_2f4 < GA[local_b8].nblock[local_c0] + -1 &&
               (local_2f0 = (uint)(*(long *)(local_18 + local_c0 * 8) < local_300[local_2f4 + 1]),
               local_2f0 == 0))) {
          local_2f4 = local_2f4 + 1;
        }
      }
      if (local_2f0 == 0) {
        local_2f4 = GA[local_b8].nblock[local_c0] + -1;
      }
      aiStack_58[local_c0] = local_2f4;
      local_c8 = GA[local_b8].nblock[local_c0] + local_c8;
    }
    local_c8 = 0;
    for (local_c0 = 0; local_c0 < GA[local_b8].ndim; local_c0 = local_c0 + 1) {
      local_318 = GA[local_b8].mapc + local_c8;
      local_304 = (int)(GA[local_b8].scale[local_c0] * (double)*(long *)(local_20 + local_c0 * 8));
      if (local_304 == GA[local_b8].nblock[local_c0]) {
        local_304 = GA[local_b8].nblock[local_c0] + -1;
      }
      local_308 = 0;
      if (*(long *)(local_20 + local_c0 * 8) < local_318[local_304]) {
        local_30c = local_304 + -1;
        while ((-1 < local_30c &&
               (local_308 = (uint)(local_318[local_30c] <= *(long *)(local_20 + local_c0 * 8)),
               local_308 == 0))) {
          local_30c = local_30c + -1;
        }
      }
      else {
        local_30c = local_304;
        while ((local_30c < GA[local_b8].nblock[local_c0] + -1 &&
               (local_308 = (uint)(*(long *)(local_20 + local_c0 * 8) < local_318[local_30c + 1]),
               local_308 == 0))) {
          local_30c = local_30c + 1;
        }
      }
      if (local_308 == 0) {
        local_30c = GA[local_b8].nblock[local_c0] + -1;
      }
      aiStack_78[local_c0] = local_30c;
      local_c8 = GA[local_b8].nblock[local_c0] + local_c8;
    }
    *local_38 = 0;
    local_d8 = 1;
    for (local_320 = 0; local_320 < sVar1; local_320 = local_320 + 1) {
      local_d8 = ((aiStack_78[local_320] - aiStack_58[local_320]) + 1) * local_d8;
      aiStack_98[local_320] = aiStack_58[local_320];
    }
    for (local_b0 = 0; local_b0 < local_d8; local_b0 = local_b0 + 1) {
      local_3b0 = 1;
      local_a0 = 0;
      for (local_3a8 = 0; local_3a8 < local_d0; local_3a8 = local_3a8 + 1) {
        local_a0 = aiStack_98[local_3a8] * local_3b0 + local_a0;
        if (local_3a8 < local_d0 + -1) {
          local_3b0 = GA[local_b8].nblock[local_3a8] * local_3b0;
        }
      }
      if (GA[local_b8].distr_type == 0) {
        if (GA[local_b8].num_rstrctd == 0) {
          local_3d8 = (long)GA[local_b8].ndim;
          local_3e0 = 0;
          local_3c0 = 1;
          for (local_3c8 = 0; local_3c8 < local_3d8; local_3c8 = local_3c8 + 1) {
            local_3c0 = GA[local_b8].nblock[local_3c8] * local_3c0;
          }
          if ((local_3c0 + -1 < local_a0) || (local_a0 < 0)) {
            for (local_3c8 = 0; local_3c8 < local_3d8; local_3c8 = local_3c8 + 1) {
              aCStack_358[local_3c8] = 0;
              aCStack_398[local_3c8] = -1;
            }
          }
          else {
            local_3d0 = local_a0;
            for (local_3c8 = 0; local_3c8 < local_3d8; local_3c8 = local_3c8 + 1) {
              local_3b8 = local_3d0 % (long)GA[local_b8].nblock[local_3c8];
              local_3d0 = local_3d0 / (long)GA[local_b8].nblock[local_3c8];
              local_3e8 = local_3b8 + local_3e0;
              local_3e0 = GA[local_b8].nblock[local_3c8] + local_3e0;
              aCStack_358[local_3c8] = GA[local_b8].mapc[local_3e8];
              if (local_3b8 == GA[local_b8].nblock[local_3c8] + -1) {
                aCStack_398[local_3c8] = GA[local_b8].dims[local_3c8];
              }
              else {
                aCStack_398[local_3c8] = GA[local_b8].mapc[local_3e8 + 1] + -1;
              }
            }
          }
        }
        else if (local_a0 < GA[local_b8].num_rstrctd) {
          local_410 = (long)GA[local_b8].ndim;
          local_418 = 0;
          local_3f8 = 1;
          for (local_400 = 0; local_400 < local_410; local_400 = local_400 + 1) {
            local_3f8 = GA[local_b8].nblock[local_400] * local_3f8;
          }
          if ((local_3f8 + -1 < local_a0) || (local_a0 < 0)) {
            for (local_400 = 0; local_400 < local_410; local_400 = local_400 + 1) {
              aCStack_358[local_400] = 0;
              aCStack_398[local_400] = -1;
            }
          }
          else {
            local_408 = local_a0;
            for (local_400 = 0; local_400 < local_410; local_400 = local_400 + 1) {
              local_3f0 = local_408 % (long)GA[local_b8].nblock[local_400];
              local_408 = local_408 / (long)GA[local_b8].nblock[local_400];
              local_420 = local_3f0 + local_418;
              local_418 = GA[local_b8].nblock[local_400] + local_418;
              aCStack_358[local_400] = GA[local_b8].mapc[local_420];
              if (local_3f0 == GA[local_b8].nblock[local_400] + -1) {
                aCStack_398[local_400] = GA[local_b8].dims[local_400];
              }
              else {
                aCStack_398[local_400] = GA[local_b8].mapc[local_420 + 1] + -1;
              }
            }
          }
        }
        else {
          sVar1 = GA[local_b8].ndim;
          local_428 = (int)sVar1;
          for (local_424 = 0; local_424 < sVar1; local_424 = local_424 + 1) {
            aCStack_358[local_424] = 0;
            aCStack_398[local_424] = -1;
          }
        }
      }
      else {
        local_488 = (int)local_a0;
        if (((GA[local_b8].distr_type == 1) || (GA[local_b8].distr_type == 2)) ||
           (GA[local_b8].distr_type == 3)) {
          sVar1 = GA[local_b8].ndim;
          local_450 = (int)sVar1;
          sVar2 = GA[local_b8].ndim;
          local_45c = (int)sVar2;
          local_454 = local_488;
          local_448[0] = (int)((long)local_488 % GA[local_b8].num_blocks[0]);
          for (local_458 = 1; local_458 < sVar2; local_458 = local_458 + 1) {
            local_454 = (int)((long)(local_454 - local_448[local_458 + -1]) /
                             GA[local_b8].num_blocks[local_458 + -1]);
            local_448[local_458] = (int)((long)local_454 % GA[local_b8].num_blocks[local_458]);
          }
          for (local_44c = 0; local_44c < sVar1; local_44c = local_44c + 1) {
            aCStack_358[local_44c] =
                 (long)local_448[local_44c] * GA[local_b8].block_dims[local_44c] + 1;
            aCStack_398[local_44c] =
                 (long)(local_448[local_44c] + 1) * GA[local_b8].block_dims[local_44c];
            if (GA[local_b8].dims[local_44c] < aCStack_398[local_44c]) {
              aCStack_398[local_44c] = GA[local_b8].dims[local_44c];
            }
          }
        }
        else if (GA[local_b8].distr_type == 4) {
          sVar1 = GA[local_b8].ndim;
          local_484 = 0;
          sVar2 = GA[local_b8].ndim;
          local_478[0] = (int)((long)local_488 % GA[local_b8].num_blocks[0]);
          for (local_48c = 1; local_48c < sVar2; local_48c = local_48c + 1) {
            local_488 = (int)((long)(local_488 - local_478[local_48c + -1]) /
                             GA[local_b8].num_blocks[local_48c + -1]);
            local_478[local_48c] = (int)((long)local_488 % GA[local_b8].num_blocks[local_48c]);
          }
          for (local_47c = 0; local_47c < sVar1; local_47c = local_47c + 1) {
            aCStack_358[local_47c] = GA[local_b8].mapc[local_484 + local_478[local_47c]];
            if ((long)local_478[local_47c] < GA[local_b8].num_blocks[local_47c] + -1) {
              aCStack_398[local_47c] = GA[local_b8].mapc[local_484 + local_478[local_47c] + 1] + -1;
            }
            else {
              aCStack_398[local_47c] = GA[local_b8].dims[local_47c];
            }
            local_484 = local_484 + (int)GA[local_b8].num_blocks[local_47c];
          }
        }
      }
      local_3a0 = *local_38 * local_d0 * 2;
      for (local_c0 = 0; local_c0 < local_d0; local_c0 = local_c0 + 1) {
        if (*(long *)(local_18 + local_c0 * 8) < aCStack_358[local_c0]) {
          local_800 = aCStack_358[local_c0];
        }
        else {
          local_800 = *(C_Integer *)(local_18 + local_c0 * 8);
        }
        *(C_Integer *)(local_28 + (local_c0 + local_3a0) * 8) = local_800;
      }
      for (local_c0 = 0; local_c0 < local_d0; local_c0 = local_c0 + 1) {
        if (aCStack_398[local_c0] < *(long *)(local_20 + local_c0 * 8)) {
          local_808 = aCStack_398[local_c0];
        }
        else {
          local_808 = *(C_Integer *)(local_20 + local_c0 * 8);
        }
        *(C_Integer *)(local_28 + (local_d0 + local_c0 + local_3a0) * 8) = local_808;
      }
      local_a8 = local_a0;
      if (GA[local_b8].num_rstrctd == 0) {
        *(long *)(local_30 + local_b0 * 8) = local_a0;
      }
      else {
        *(C_Integer *)(local_30 + local_b0 * 8) = GA[local_b8].rstrctd_list[local_a0];
      }
      for (local_498 = 0; local_498 < local_d0; local_498 = local_498 + 1) {
        if (aiStack_98[local_498] < aiStack_78[local_498]) {
          aiStack_98[local_498] = aiStack_98[local_498] + 1;
          break;
        }
        aiStack_98[local_498] = aiStack_58[local_498];
      }
      *local_38 = *local_38 + 1;
    }
  }
  else if (GA[local_b8].distr_type == 4) {
    pnga_pgroup_nnodes((long)GA[local_b8].p_handle);
    local_c8 = 0;
    for (local_c0 = 0; local_c0 < GA[local_b8].ndim; local_c0 = local_c0 + 1) {
      pCVar3 = GA[local_b8].mapc;
      local_4a4 = (int)(GA[local_b8].scale[local_c0] * (double)*(long *)(local_18 + local_c0 * 8));
      if ((long)local_4a4 == GA[local_b8].num_blocks[local_c0]) {
        local_4a4 = (int)GA[local_b8].num_blocks[local_c0] + -1;
      }
      bVar4 = false;
      if (*(long *)(local_18 + local_c0 * 8) < pCVar3[local_c8 + local_4a4]) {
        do {
          local_4ac = local_4a4 + -1;
          if (local_4ac < 0) break;
          bVar4 = pCVar3[local_c8 + local_4ac] <= *(long *)(local_18 + local_c0 * 8);
          local_4a4 = local_4ac;
        } while (!bVar4);
      }
      else {
        local_4ac = local_4a4;
        while (((long)local_4ac < GA[local_b8].num_blocks[local_c0] + -1 &&
               (bVar4 = *(long *)(local_18 + local_c0 * 8) < pCVar3[local_c8 + (local_4ac + 1)],
               !bVar4))) {
          local_4ac = local_4ac + 1;
        }
      }
      if (!bVar4) {
        local_4ac = (int)GA[local_b8].num_blocks[local_c0] + -1;
      }
      aiStack_58[local_c0] = local_4ac;
      local_c8 = GA[local_b8].num_blocks[local_c0] + local_c8;
    }
    local_c8 = 0;
    for (local_c0 = 0; local_c0 < GA[local_b8].ndim; local_c0 = local_c0 + 1) {
      pCVar3 = GA[local_b8].mapc;
      local_4bc = (int)(GA[local_b8].scale[local_c0] * (double)*(long *)(local_20 + local_c0 * 8));
      if ((long)local_4bc == GA[local_b8].num_blocks[local_c0]) {
        local_4bc = (int)GA[local_b8].num_blocks[local_c0] + -1;
      }
      bVar4 = false;
      if (*(long *)(local_20 + local_c0 * 8) < pCVar3[local_c8 + local_4bc]) {
        do {
          local_4c4 = local_4bc + -1;
          if (local_4c4 < 0) break;
          bVar4 = pCVar3[local_c8 + local_4c4] <= *(long *)(local_20 + local_c0 * 8);
          local_4bc = local_4c4;
        } while (!bVar4);
      }
      else {
        local_4c4 = local_4bc;
        while (((long)local_4c4 < GA[local_b8].num_blocks[local_c0] + -1 &&
               (bVar4 = *(long *)(local_20 + local_c0 * 8) < pCVar3[local_c8 + (local_4c4 + 1)],
               !bVar4))) {
          local_4c4 = local_4c4 + 1;
        }
      }
      if (!bVar4) {
        local_4c4 = (int)GA[local_b8].num_blocks[local_c0] + -1;
      }
      aiStack_78[local_c0] = local_4c4;
      local_c8 = GA[local_b8].num_blocks[local_c0] + local_c8;
    }
    *local_38 = 0;
    local_d8 = 1;
    for (local_4d8 = 0; local_4d8 < local_d0; local_4d8 = local_4d8 + 1) {
      local_d8 = ((aiStack_78[local_4d8] - aiStack_58[local_4d8]) + 1) * local_d8;
      aiStack_98[local_4d8] = aiStack_58[local_4d8];
    }
    for (local_b0 = 0; local_b0 < local_d8; local_b0 = local_b0 + 1) {
      local_570 = 1;
      local_a0 = 0;
      for (local_568 = 0; local_568 < local_d0; local_568 = local_568 + 1) {
        local_a0 = aiStack_98[local_568] * local_570 + local_a0;
        if (local_568 < local_d0 + -1) {
          local_570 = GA[local_b8].num_blocks[local_568] * local_570;
        }
      }
      *(long *)(local_30 + local_b0 * 8) = local_a0;
      if (GA[local_b8].distr_type == 0) {
        if (GA[local_b8].num_rstrctd == 0) {
          local_598 = (long)GA[local_b8].ndim;
          local_5a0 = 0;
          local_580 = 1;
          for (local_588 = 0; local_588 < local_598; local_588 = local_588 + 1) {
            local_580 = GA[local_b8].nblock[local_588] * local_580;
          }
          if ((local_580 + -1 < local_a0) || (local_a0 < 0)) {
            for (local_588 = 0; local_588 < local_598; local_588 = local_588 + 1) {
              *(undefined8 *)(&stack0xfffffffffffffae8 + local_588 * 8) = 0;
              aCStack_558[local_588] = -1;
            }
          }
          else {
            local_590 = local_a0;
            for (local_588 = 0; local_588 < local_598; local_588 = local_588 + 1) {
              local_578 = local_590 % (long)GA[local_b8].nblock[local_588];
              local_590 = local_590 / (long)GA[local_b8].nblock[local_588];
              local_5a8 = local_578 + local_5a0;
              local_5a0 = GA[local_b8].nblock[local_588] + local_5a0;
              *(C_Integer *)(&stack0xfffffffffffffae8 + local_588 * 8) =
                   GA[local_b8].mapc[local_5a8];
              if (local_578 == GA[local_b8].nblock[local_588] + -1) {
                aCStack_558[local_588] = GA[local_b8].dims[local_588];
              }
              else {
                aCStack_558[local_588] = GA[local_b8].mapc[local_5a8 + 1] + -1;
              }
            }
          }
        }
        else if (local_a0 < GA[local_b8].num_rstrctd) {
          local_5d0 = (long)GA[local_b8].ndim;
          local_5d8 = 0;
          local_5b8 = 1;
          for (local_5c0 = 0; local_5c0 < local_5d0; local_5c0 = local_5c0 + 1) {
            local_5b8 = GA[local_b8].nblock[local_5c0] * local_5b8;
          }
          if ((local_5b8 + -1 < local_a0) || (local_a0 < 0)) {
            for (local_5c0 = 0; local_5c0 < local_5d0; local_5c0 = local_5c0 + 1) {
              *(undefined8 *)(&stack0xfffffffffffffae8 + local_5c0 * 8) = 0;
              aCStack_558[local_5c0] = -1;
            }
          }
          else {
            local_5c8 = local_a0;
            for (local_5c0 = 0; local_5c0 < local_5d0; local_5c0 = local_5c0 + 1) {
              local_5b0 = local_5c8 % (long)GA[local_b8].nblock[local_5c0];
              local_5c8 = local_5c8 / (long)GA[local_b8].nblock[local_5c0];
              local_5e0 = local_5b0 + local_5d8;
              local_5d8 = GA[local_b8].nblock[local_5c0] + local_5d8;
              *(C_Integer *)(&stack0xfffffffffffffae8 + local_5c0 * 8) =
                   GA[local_b8].mapc[local_5e0];
              if (local_5b0 == GA[local_b8].nblock[local_5c0] + -1) {
                aCStack_558[local_5c0] = GA[local_b8].dims[local_5c0];
              }
              else {
                aCStack_558[local_5c0] = GA[local_b8].mapc[local_5e0 + 1] + -1;
              }
            }
          }
        }
        else {
          sVar1 = GA[local_b8].ndim;
          local_5e8 = (int)sVar1;
          for (local_5e4 = 0; local_5e4 < sVar1; local_5e4 = local_5e4 + 1) {
            *(undefined8 *)(&stack0xfffffffffffffae8 + (long)local_5e4 * 8) = 0;
            aCStack_558[local_5e4] = -1;
          }
        }
      }
      else {
        local_648 = (int)local_a0;
        if (((GA[local_b8].distr_type == 1) || (GA[local_b8].distr_type == 2)) ||
           (GA[local_b8].distr_type == 3)) {
          sVar1 = GA[local_b8].ndim;
          local_610 = (int)sVar1;
          sVar2 = GA[local_b8].ndim;
          local_61c = (int)sVar2;
          local_614 = local_648;
          local_608[0] = (int)((long)local_648 % GA[local_b8].num_blocks[0]);
          for (local_618 = 1; local_618 < sVar2; local_618 = local_618 + 1) {
            local_614 = (int)((long)(local_614 - local_608[local_618 + -1]) /
                             GA[local_b8].num_blocks[local_618 + -1]);
            local_608[local_618] = (int)((long)local_614 % GA[local_b8].num_blocks[local_618]);
          }
          for (local_60c = 0; local_60c < sVar1; local_60c = local_60c + 1) {
            *(long *)(&stack0xfffffffffffffae8 + (long)local_60c * 8) =
                 (long)local_608[local_60c] * GA[local_b8].block_dims[local_60c] + 1;
            aCStack_558[local_60c] =
                 (long)(local_608[local_60c] + 1) * GA[local_b8].block_dims[local_60c];
            if (GA[local_b8].dims[local_60c] < aCStack_558[local_60c]) {
              aCStack_558[local_60c] = GA[local_b8].dims[local_60c];
            }
          }
        }
        else if (GA[local_b8].distr_type == 4) {
          sVar1 = GA[local_b8].ndim;
          local_644 = 0;
          sVar2 = GA[local_b8].ndim;
          local_638[0] = (int)((long)local_648 % GA[local_b8].num_blocks[0]);
          for (local_64c = 1; local_64c < sVar2; local_64c = local_64c + 1) {
            local_648 = (int)((long)(local_648 - local_638[local_64c + -1]) /
                             GA[local_b8].num_blocks[local_64c + -1]);
            local_638[local_64c] = (int)((long)local_648 % GA[local_b8].num_blocks[local_64c]);
          }
          for (local_63c = 0; local_63c < sVar1; local_63c = local_63c + 1) {
            *(C_Integer *)(&stack0xfffffffffffffae8 + (long)local_63c * 8) =
                 GA[local_b8].mapc[local_644 + local_638[local_63c]];
            if ((long)local_638[local_63c] < GA[local_b8].num_blocks[local_63c] + -1) {
              aCStack_558[local_63c] = GA[local_b8].mapc[local_644 + local_638[local_63c] + 1] + -1;
            }
            else {
              aCStack_558[local_63c] = GA[local_b8].dims[local_63c];
            }
            local_644 = local_644 + (int)GA[local_b8].num_blocks[local_63c];
          }
        }
      }
      local_560 = *local_38 * local_d0 * 2;
      for (local_c0 = 0; local_c0 < local_d0; local_c0 = local_c0 + 1) {
        if (*(long *)(local_18 + local_c0 * 8) < *(long *)(&stack0xfffffffffffffae8 + local_c0 * 8))
        {
          local_810 = *(undefined8 *)(&stack0xfffffffffffffae8 + local_c0 * 8);
        }
        else {
          local_810 = *(undefined8 *)(local_18 + local_c0 * 8);
        }
        *(undefined8 *)(local_28 + (local_c0 + local_560) * 8) = local_810;
      }
      for (local_c0 = 0; local_c0 < local_d0; local_c0 = local_c0 + 1) {
        if (aCStack_558[local_c0] < *(long *)(local_20 + local_c0 * 8)) {
          local_818 = aCStack_558[local_c0];
        }
        else {
          local_818 = *(C_Integer *)(local_20 + local_c0 * 8);
        }
        *(C_Integer *)(local_28 + (local_d0 + local_c0 + local_560) * 8) = local_818;
      }
      for (local_658 = 0; local_658 < local_d0; local_658 = local_658 + 1) {
        if (aiStack_98[local_658] < aiStack_78[local_658]) {
          aiStack_98[local_658] = aiStack_98[local_658] + 1;
          break;
        }
        aiStack_98[local_658] = aiStack_58[local_658];
      }
      *local_38 = *local_38 + 1;
    }
  }
  else if (GA[local_b8].distr_type == 1) {
    lVar5 = GA[local_b8].block_total;
    local_6f0 = 0;
    for (local_b0 = 0; local_b0 < lVar5; local_b0 = local_b0 + 1) {
      bVar4 = true;
      pnga_distribution(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                        in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      for (local_670 = 0; local_670 < local_d0 && bVar4; local_670 = local_670 + 1) {
        if (((local_6a8[local_670] < *(long *)(local_18 + local_670 * 8)) ||
            (*(long *)(local_20 + local_670 * 8) < local_6a8[local_670])) &&
           ((local_6e8[local_670] < *(long *)(local_18 + local_670 * 8) ||
            (*(long *)(local_20 + local_670 * 8) < local_6e8[local_670])))) {
          bVar4 = false;
        }
      }
      if (bVar4) {
        *(long *)(local_30 + local_6f0 * 8) = local_b0;
        local_6f0 = local_6f0 + 1;
      }
    }
    *local_38 = local_6f0;
    for (local_b0 = 0; local_b0 < local_6f0; local_b0 = local_b0 + 1) {
      local_6f8 = local_b0 * 2 * local_d0;
      pnga_distribution(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                        in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      for (local_670 = 0; local_670 < local_d0; local_670 = local_670 + 1) {
        if (*(long *)(local_18 + local_670 * 8) < local_6a8[local_670]) {
          local_828 = local_6a8[local_670];
        }
        else {
          local_828 = *(long *)(local_18 + local_670 * 8);
        }
        *(long *)(local_28 + (local_6f8 + local_670) * 8) = local_828;
        if (local_6e8[local_670] < *(long *)(local_20 + local_670 * 8)) {
          local_830 = local_6e8[local_670];
        }
        else {
          local_830 = *(long *)(local_20 + local_670 * 8);
        }
        *(long *)(local_28 + (local_6f8 + local_d0 + local_670) * 8) = local_830;
      }
    }
  }
  else if ((GA[local_b8].distr_type == 2) || (GA[local_b8].distr_type == 3)) {
    local_7c8 = 0;
    for (local_b0 = 0; local_b0 < local_d0; local_b0 = local_b0 + 1) {
      alStackY_738[local_b0] =
           (*(long *)(local_18 + local_b0 * 8) + -1) / GA[local_b8].block_dims[local_b0];
      alStackY_778[local_b0] =
           (*(long *)(local_20 + local_b0 * 8) + -1) / GA[local_b8].block_dims[local_b0];
      local_7b8[local_b0] = alStackY_738[local_b0];
    }
    while (local_7b8[local_d0 + -1] <= alStackY_778[local_d0 + -1]) {
      local_7d8 = 0;
      local_7e0 = 1;
      pnga_pgroup_nnodes((long)GA[local_b8].p_handle);
      for (local_b0 = local_d0 + -1; -1 < local_b0; local_b0 = local_b0 + -1) {
        local_7d8 = local_7d8 * local_7e0 + local_7b8[local_b0];
        local_7e0 = GA[local_b8].num_blocks[local_b0] * local_7e0;
      }
      *(long *)(local_30 + local_7c8 * 8) = local_7d8;
      lVar5 = local_7c8 * 2 * local_d0;
      for (local_b0 = 0; local_b0 < local_d0; local_b0 = local_b0 + 1) {
        *(long *)(local_28 + (lVar5 + local_b0) * 8) =
             local_7b8[local_b0] * GA[local_b8].block_dims[local_b0] + 1;
        *(long *)(local_28 + (lVar5 + local_d0 + local_b0) * 8) =
             (local_7b8[local_b0] + 1) * GA[local_b8].block_dims[local_b0];
        if (GA[local_b8].dims[local_b0] < *(long *)(local_28 + (lVar5 + local_d0 + local_b0) * 8)) {
          *(C_Integer *)(local_28 + (lVar5 + local_d0 + local_b0) * 8) = GA[local_b8].dims[local_b0]
          ;
        }
      }
      local_7c8 = local_7c8 + 1;
      local_7b8[0] = local_7b8[0] + 1;
      for (local_b0 = 0; alStackY_778[local_b0] < local_7b8[local_b0] && local_b0 < local_d0;
          local_b0 = local_b0 + 1) {
        if (local_b0 < local_d0 + -1) {
          local_7b8[local_b0] = alStackY_738[local_b0];
        }
        if (local_b0 < local_d0 + -1) {
          local_7b8[local_b0 + 1] = local_7b8[local_b0 + 1] + 1;
        }
      }
    }
    *local_38 = local_7c8;
  }
  return 1;
}

Assistant:

logical pnga_locate_region( Integer g_a,
                            Integer *lo,
                            Integer *hi,
                            Integer *map,
                            Integer *proclist,
                            Integer *np)
/*    g_a      [input]  global array handle
      lo       [input]  lower indices of patch in global array
      hi       [input]  upper indices of patch in global array
      map      [output] list of lower and upper indices for portion of
                        patch that exists on each processor containing a
                        portion of the patch. The map is constructed so
                        that for a D dimensional global array, the first
                        D elements are the lower indices on the first
                        processor in proclist, the next D elements are
                        the upper indices of the first processor in
                        proclist, the next D elements are the lower
                        indices for the second processor in proclist, and
                        so on.
      proclist [output] list of processors containing some portion of the
                        patch
      np       [output] total number of processors containing a portion
                        of the patch

      For a block cyclic data distribution, this function returns a list of
      blocks that cover the region along with the lower and upper indices of
      each block.
*/
{
  int  procT[MAXDIM], procB[MAXDIM], proc_subscript[MAXDIM];
  Integer  proc, owner, i, ga_handle;
  Integer  d, dpos, ndim, elems, use_blocks;
  /* Integer  p_handle; */

  ga_check_handleM(g_a, "nga_locate_region");

  ga_handle = GA_OFFSET + g_a;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))return FALSE;

  ndim = GA[ga_handle].ndim;

  if (GA[ga_handle].distr_type == REGULAR) {
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].nblock);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];
      Integer  offset;

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].nblock); 
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      offset = *np *(ndim*2); /* location in map to put patch range */

      for(d = 0; d< ndim; d++)
        map[d + offset ] = lo[d] < _lo[d] ? _lo[d] : lo[d];

      for(d = 0; d< ndim; d++)
        map[ndim + d + offset ] = hi[d] > _hi[d] ? _hi[d] : hi[d];

      owner = proc;
      if (GA[ga_handle].num_rstrctd == 0) {
        proclist[i] = owner;
      } else {
        proclist[i] = GA[ga_handle].rstrctd_list[owner];
      }
      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].nblock);
      (*np)++;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    Integer nproc = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */
    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].num_blocks[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].num_blocks[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].num_blocks[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].num_blocks[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].num_blocks);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];
      Integer  offset;

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].num_blocks); 
      proclist[i] = proc;
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      offset = *np *(ndim*2); /* location in map to put patch range */


      for(d = 0; d< ndim; d++)
        map[d + offset ] = lo[d] < _lo[d] ? _lo[d] : lo[d];

      for(d = 0; d< ndim; d++)
        map[ndim + d + offset ] = hi[d] > _hi[d] ? _hi[d] : hi[d];

      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].num_blocks);
      (*np)++;
    }
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, j, tlo[MAXDIM], thi[MAXDIM], cnt;
    Integer offset;
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }
      /* store blocks that overlap request region in proclist */
      if (chk) {
        proclist[cnt] = i;
        cnt++;
      }
    }
    *np = cnt;

    /* fill map array with block coordinates */
    for (i=0; i<cnt; i++) {
      offset = i*2*ndim;
      j = proclist[i];
      pnga_distribution(g_a,j,tlo,thi);
      for (j=0; j<ndim; j++) {
        map[offset + j] = lo[j] < tlo[j] ? tlo[j] : lo[j];
        map[offset + ndim + j] = hi[j] > thi[j] ? thi[j] : hi[j];
      }
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK ||
             GA[ga_handle].distr_type == TILED) {
    /* find min and max block coordinates of region */
    Integer min[MAXDIM], max[MAXDIM];
    Integer count[MAXDIM];
    Integer total_blocks = 1;
    Integer cnt = 0;
    Integer offset;
    for (i=0; i<ndim; i++) {
      min[i] = (lo[i]-1)/GA[ga_handle].block_dims[i];
      max[i] = (hi[i]-1)/GA[ga_handle].block_dims[i];
      total_blocks *= (max[i]-min[i]+1);
      count[i] = min[i];
    }
    while (count[ndim-1]<=max[ndim-1]) {
      /* Calculate block index */
      Integer idx = 0;
      Integer factor = 1;
      Integer iproc;
      Integer p_handle = GA[ga_handle].p_handle;
      Integer size = pnga_pgroup_nnodes(p_handle);
      for (i=ndim-1; i>=0; i--) {
        idx = idx*factor+count[i];
        factor *= GA[ga_handle].num_blocks[i];
      }
      proclist[cnt] = idx;
      /* store information on this block */
      offset = 2*cnt*ndim;
      for (i=0; i<ndim; i++) {
        map[offset+i] = count[i]*GA[ga_handle].block_dims[i]+1;
        map[offset+ndim+i] = (count[i]+1)*GA[ga_handle].block_dims[i];
        if (map[offset+ndim+i] > GA[ga_handle].dims[i])
          map[offset+ndim+i] = GA[ga_handle].dims[i];
      }
      cnt++;
      /* Increment count array */
      i = 0;
      count[0]++;
      while (count[i] > max[i] && i<ndim) {
        if (i<ndim-1) count[i] = min[i];
        if (i<ndim-1) {
          count[i+1]++;
        }
        i++;
      }
    }
    *np = cnt;
  }
  return(TRUE);
}